

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tls.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *__nptr;
  
  OPENSSL_init_crypto(0x4c);
  __nptr = getenv("VERBOSE");
  if (__nptr != (char *)0x0) {
    verbose = atoi(__nptr);
  }
  test("rsa",(char *)0x0);
  test("gost2012_256","A");
  test("gost2012_256","B");
  test("gost2012_256","C");
  test("gost2012_256","TCA");
  test("gost2012_512","A");
  test("gost2012_512","B");
  test("gost2012_512","C");
  printf("\x1b[0;32m= All tests passed!\n\x1b[m");
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    int ret = 0;

    OPENSSL_add_all_algorithms_conf();

    char *p;
    if ((p = getenv("VERBOSE")))
	verbose = atoi(p);

    ret |= test("rsa", NULL);
    cipher_list = "LEGACY-GOST2012-GOST8912-GOST8912";
    ret |= test("gost2012_256", "A");
    ret |= test("gost2012_256", "B");
    ret |= test("gost2012_256", "C");
    ret |= test("gost2012_256", "TCA");
    ret |= test("gost2012_512", "A");
    ret |= test("gost2012_512", "B");
    ret |= test("gost2012_512", "C");

    if (ret)
	printf(cDRED "= Some tests FAILED!\n" cNORM);
    else
	printf(cDGREEN "= All tests passed!\n" cNORM);
    return ret;
}